

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O3

uint8_t * ogt_vox_write_scene(ogt_vox_scene *scene,uint32_t *buffer_size)

{
  uint8_t uVar1;
  uint32_t uVar2;
  ogt_vox_model *poVar3;
  ogt_vox_group *poVar4;
  ogt_vox_instance *poVar5;
  ogt_vox_cam *poVar6;
  ogt_vox_layer *poVar7;
  size_t sVar8;
  ogt_vox_scene *poVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint32_t group_index;
  uint uVar14;
  ulong uVar15;
  ogt_vox_matl_array *poVar16;
  char *value;
  uchar *puVar17;
  char *pcVar18;
  int32_t i;
  int iVar19;
  undefined4 uVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  undefined4 local_53c;
  _vox_array<unsigned_char> local_538;
  ogt_vox_scene *local_520;
  ulong local_518;
  ulong local_510;
  ulong local_508;
  uint32_t *local_500;
  ulong local_4f8;
  ulong local_4f0;
  char cam_angle [64];
  char cam_fov [32];
  char cam_frustum [32];
  char cam_radius [32];
  char value_str [64];
  
  local_538.data = (uchar *)0x0;
  local_538.capacity = 0;
  local_538.count = 0;
  local_500 = buffer_size;
  local_538.data = (uchar *)_vox_realloc((void *)0x0,0,0x400);
  local_538.capacity = 0x400;
  builtin_strncpy(value_str,"VOX ",4);
  _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
  value_str[0] = -0x6a;
  value_str[1] = '\0';
  value_str[2] = '\0';
  value_str[3] = '\0';
  _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
  builtin_strncpy(value_str,"MAIN",4);
  _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
  value_str[0] = '\0';
  value_str[1] = '\0';
  value_str[2] = '\0';
  value_str[3] = '\0';
  _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
  value_str._0_8_ = (ulong)(uint)value_str._4_4_ << 0x20;
  _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
  local_4f8 = local_538.count;
  local_520 = scene;
  if (scene->num_models != 0) {
    uVar13 = 0;
    do {
      poVar3 = scene->models[uVar13];
      if (((0x100 < poVar3->size_x) || (0x100 < poVar3->size_y)) || (0x100 < poVar3->size_z)) {
        __assert_fail("(model->size_x <= 256 && model->size_y <= 256 && model->size_z <= 256) && (\"model dimensions exceed the limit of 256x256x256\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0x96d,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
      }
      uVar12 = poVar3->size_y * poVar3->size_x * poVar3->size_z;
      local_510 = CONCAT44(local_510._4_4_,(int)uVar13);
      if (uVar12 == 0) {
        iVar19 = 0;
      }
      else {
        uVar13 = 0;
        iVar19 = 0;
        do {
          iVar19 = (iVar19 + 1) - (uint)(poVar3->voxel_data[uVar13] == '\0');
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
      builtin_strncpy(value_str,"SIZE",4);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str[0] = '\f';
      value_str[1] = '\0';
      value_str[2] = '\0';
      value_str[3] = '\0';
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str[0] = '\0';
      value_str[1] = '\0';
      value_str[2] = '\0';
      value_str[3] = '\0';
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      if (((poVar3->size_x == 0) || (poVar3->size_y == 0)) || (poVar3->size_z == 0)) {
        __assert_fail("(model->size_x && model->size_y && model->size_z) && (\"model has zero size\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0x97c,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
      }
      value_str._0_4_ = poVar3->size_x;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str._0_4_ = poVar3->size_y;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str._0_4_ = poVar3->size_z;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      builtin_strncpy(value_str,"XYZI",4);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str._0_4_ = iVar19 * 4 + 4;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str[0] = '\0';
      value_str[1] = '\0';
      value_str[2] = '\0';
      value_str[3] = '\0';
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str[0] = (char)iVar19;
      value_str[1] = (char)((uint)iVar19 >> 8);
      value_str[2] = (char)((uint)iVar19 >> 0x10);
      value_str[3] = (char)((uint)iVar19 >> 0x18);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      uVar12 = poVar3->size_z;
      if (uVar12 != 0) {
        uVar11 = poVar3->size_y;
        local_518 = 0;
        local_508 = local_508 & 0xffffffff00000000;
        uVar14 = uVar11;
        do {
          if (uVar14 == 0) {
            uVar14 = 0;
          }
          else {
            uVar12 = poVar3->size_x;
            uVar22 = 0;
            uVar14 = uVar12;
            do {
              if (uVar14 == 0) {
                uVar14 = 0;
              }
              else {
                uVar14 = 0;
                do {
                  uVar1 = poVar3->voxel_data[(int)local_518 + uVar14];
                  if (uVar1 != '\0') {
                    value_str[0] = (char)uVar14;
                    _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,1);
                    value_str[0] = (char)uVar22;
                    _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,1);
                    value_str[0] = (char)local_508;
                    _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,1);
                    value_str[0] = uVar1;
                    _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,1);
                    uVar12 = poVar3->size_x;
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 < uVar12);
                uVar11 = poVar3->size_y;
                local_518 = (ulong)((int)local_518 + uVar14);
                uVar14 = uVar12;
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 < uVar11);
            uVar12 = poVar3->size_z;
            uVar14 = uVar11;
          }
          uVar22 = (int)local_508 + 1;
          local_508 = CONCAT44(local_508._4_4_,uVar22);
        } while (uVar22 < uVar12);
      }
      scene = local_520;
      uVar12 = (int)local_510 + 1;
      uVar13 = (ulong)uVar12;
      if ((g_progress_callback_func != (ogt_vox_progress_callback_func)0x0) &&
         (bVar10 = (*g_progress_callback_func)
                             ((float)uVar13 / (float)(local_520->num_models + 1),
                              g_progress_callback_user_data), !bVar10)) {
        *local_500 = 0;
        puVar17 = (uint8_t *)0x0;
        goto LAB_0010789a;
      }
    } while (uVar12 < scene->num_models);
  }
  uVar2 = scene->num_groups;
  if (uVar2 == 0) {
    __assert_fail("(scene->num_groups > 0) && (\"no groups found in scene\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x9a2,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
  }
  uVar13 = local_4f8 & 0xffffffff;
  local_510 = (ulong)(uVar2 * 2);
  local_4f0 = (ulong)scene->num_instances;
  lVar23 = 0x58;
  uVar15 = 0;
  do {
    poVar4 = scene->groups;
    _vox_file_write_chunk_nTRN
              ((_vox_file_writeable *)&local_538,(uint32_t)uVar15,uVar2 + (uint32_t)uVar15,
               *(char **)((long)poVar4 + lVar23 + -0x58),*(bool *)((long)poVar4 + lVar23 + -8),
               (ogt_vox_transform *)((long)poVar4 + lVar23 + -0x50),
               *(uint32_t *)((long)poVar4 + lVar23 + -0xc),
               (ogt_vox_anim_transform *)((long)&poVar4->name + lVar23));
    uVar15 = uVar15 + 1;
    uVar21 = (ulong)scene->num_groups;
    lVar23 = lVar23 + 0x68;
  } while (uVar15 < uVar21);
  if (scene->num_groups != 0) {
    local_518 = (ulong)(uint)((int)local_510 + (int)local_4f0);
    uVar15 = 0;
    do {
      lVar23 = 0;
      iVar19 = 0;
      do {
        iVar19 = iVar19 + (uint)(uVar15 ==
                                *(uint *)((long)&scene->groups->parent_group_index + lVar23));
        lVar23 = lVar23 + 0x68;
      } while ((ulong)((int)uVar21 + (uint)((int)uVar21 == 0)) * 0x68 - lVar23 != 0);
      if ((ulong)local_520->num_instances != 0) {
        lVar23 = 0;
        do {
          iVar19 = iVar19 + (uint)(uVar15 ==
                                  *(uint *)((long)&local_520->instances->group_index + lVar23));
          lVar23 = lVar23 + 0x78;
        } while ((ulong)local_520->num_instances * 0x78 - lVar23 != 0);
      }
      bVar10 = scene->groups[uVar15].hidden;
      pcVar18 = (char *)0x0;
      if (bVar10 != false) {
        pcVar18 = "1";
      }
      local_508 = local_538.count;
      builtin_strncpy(value_str,"nGRP",4);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str[0] = '\0';
      value_str[1] = '\0';
      value_str[2] = '\0';
      value_str[3] = '\0';
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str[0] = '\0';
      value_str[1] = '\0';
      value_str[2] = '\0';
      value_str[3] = '\0';
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str._0_4_ = uVar2 + (int)uVar15;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str._0_4_ = ZEXT14(bVar10);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_hidden",pcVar18);
      value_str[0] = (char)iVar19;
      value_str[1] = (char)((uint)iVar19 >> 8);
      value_str[2] = (char)((uint)iVar19 >> 0x10);
      value_str[3] = (char)((uint)iVar19 >> 0x18);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      uVar12 = local_520->num_groups;
      if (uVar12 != 0) {
        lVar23 = 0x48;
        uVar21 = 0;
        do {
          if (uVar15 == *(uint *)((long)&local_520->groups->name + lVar23)) {
            uVar20 = (undefined4)uVar21;
            value_str[0] = (char)uVar20;
            value_str[1] = (char)((uint)uVar20 >> 8);
            value_str[2] = (char)((uint)uVar20 >> 0x10);
            value_str[3] = (char)((uint)uVar20 >> 0x18);
            _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
            uVar12 = local_520->num_groups;
          }
          uVar21 = uVar21 + 1;
          lVar23 = lVar23 + 0x68;
        } while (uVar21 < uVar12);
      }
      uVar12 = local_520->num_instances;
      if (uVar12 != 0) {
        lVar23 = 0x50;
        uVar21 = 0;
        do {
          if (uVar15 == *(uint *)((long)&local_520->instances->name + lVar23)) {
            value_str._0_4_ = (int)local_518 + (int)uVar21;
            _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
            uVar12 = local_520->num_instances;
          }
          uVar21 = uVar21 + 1;
          lVar23 = lVar23 + 0x78;
        } while (uVar21 < uVar12);
      }
      uVar21 = (ulong)((int)local_508 + 4);
      if (local_538.count < uVar21 + 4) goto LAB_00107905;
      *(int *)(local_538.data + uVar21) = ((int)local_538.count - (int)local_508) + -0xc;
      uVar15 = uVar15 + 1;
      uVar21 = (ulong)local_520->num_groups;
      scene = local_520;
    } while (uVar15 < uVar21);
  }
  if (scene->num_instances != 0) {
    uVar15 = 0;
    do {
      poVar5 = scene->instances;
      local_518 = local_538.count;
      builtin_strncpy(value_str,"nSHP",4);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str[0] = '\0';
      value_str[1] = '\0';
      value_str[2] = '\0';
      value_str[3] = '\0';
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str[0] = '\0';
      value_str[1] = '\0';
      value_str[2] = '\0';
      value_str[3] = '\0';
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str._0_4_ = (int)local_510 + (int)uVar15;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      bVar10 = poVar5[uVar15].model_anim.loop;
      value_str._0_4_ = ZEXT14(bVar10);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      pcVar18 = (char *)0x0;
      if (bVar10 != false) {
        pcVar18 = "1";
      }
      _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_loop",pcVar18);
      uVar2 = poVar5[uVar15].model_anim.num_keyframes;
      if (uVar2 == 0) {
        value_str[0] = '\x01';
        value_str[1] = '\0';
        value_str[2] = '\0';
        value_str[3] = '\0';
        _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
        value_str._0_4_ = poVar5[uVar15].model_index;
        _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
        value_str._0_8_ = (ulong)(uint)value_str._4_4_ << 0x20;
        _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      }
      else {
        value_str[0] = (char)uVar2;
        value_str[1] = (char)(uVar2 >> 8);
        value_str[2] = (char)(uVar2 >> 0x10);
        value_str[3] = (char)(uVar2 >> 0x18);
        _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
        if (poVar5[uVar15].model_anim.num_keyframes != 0) {
          uVar21 = 0;
          do {
            value_str._0_4_ = poVar5[uVar15].model_anim.keyframes[uVar21].model_index;
            _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
            value_str[0] = '\x01';
            value_str[1] = '\0';
            value_str[2] = '\0';
            value_str[3] = '\0';
            _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
            snprintf(value_str,0x40,"%i",
                     (ulong)poVar5[uVar15].model_anim.keyframes[uVar21].frame_index);
            _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_f",value_str);
            uVar21 = uVar21 + 1;
          } while (uVar21 < poVar5[uVar15].model_anim.num_keyframes);
        }
      }
      scene = local_520;
      uVar21 = (ulong)((int)local_518 + 4);
      if (local_538.count < uVar21 + 4) goto LAB_00107905;
      *(int *)(local_538.data + uVar21) = ((int)local_538.count - (int)local_518) + -0xc;
      uVar15 = uVar15 + 1;
    } while (uVar15 < local_520->num_instances);
    if (local_520->num_instances != 0) {
      lVar23 = 0x58;
      uVar21 = 0;
      uVar15 = local_510;
      do {
        poVar5 = scene->instances;
        uVar2 = (uint32_t)uVar15;
        _vox_file_write_chunk_nTRN
                  ((_vox_file_writeable *)&local_538,(int)local_4f0 + uVar2,uVar2,
                   *(char **)((long)poVar5 + lVar23 + -0x58),*(bool *)((long)poVar5 + lVar23 + -4),
                   (ogt_vox_transform *)((long)poVar5 + lVar23 + -0x50),
                   *(uint32_t *)((long)poVar5 + lVar23 + -0xc),
                   (ogt_vox_anim_transform *)((long)&poVar5->name + lVar23));
        uVar21 = uVar21 + 1;
        uVar15 = (ulong)(uVar2 + 1);
        lVar23 = lVar23 + 0x78;
      } while (uVar21 < scene->num_instances);
    }
  }
  if (scene->num_cameras != 0) {
    lVar23 = 0x28;
    uVar15 = 0;
    do {
      poVar6 = scene->cameras;
      value_str[0x30] = '\0';
      value_str[0x31] = '\0';
      value_str[0x32] = '\0';
      value_str[0x33] = '\0';
      value_str[0x34] = '\0';
      value_str[0x35] = '\0';
      value_str[0x36] = '\0';
      value_str[0x37] = '\0';
      value_str[0x38] = '\0';
      value_str[0x39] = '\0';
      value_str[0x3a] = '\0';
      value_str[0x3b] = '\0';
      value_str[0x3c] = '\0';
      value_str[0x3d] = '\0';
      value_str[0x3e] = '\0';
      value_str[0x3f] = '\0';
      value_str[0x20] = '\0';
      value_str[0x21] = '\0';
      value_str[0x22] = '\0';
      value_str[0x23] = '\0';
      value_str[0x24] = '\0';
      value_str[0x25] = '\0';
      value_str[0x26] = '\0';
      value_str[0x27] = '\0';
      value_str[0x28] = '\0';
      value_str[0x29] = '\0';
      value_str[0x2a] = '\0';
      value_str[0x2b] = '\0';
      value_str[0x2c] = '\0';
      value_str[0x2d] = '\0';
      value_str[0x2e] = '\0';
      value_str[0x2f] = '\0';
      value_str[0x10] = '\0';
      value_str[0x11] = '\0';
      value_str[0x12] = '\0';
      value_str[0x13] = '\0';
      value_str[0x14] = '\0';
      value_str[0x15] = '\0';
      value_str[0x16] = '\0';
      value_str[0x17] = '\0';
      value_str[0x18] = '\0';
      value_str[0x19] = '\0';
      value_str[0x1a] = '\0';
      value_str[0x1b] = '\0';
      value_str[0x1c] = '\0';
      value_str[0x1d] = '\0';
      value_str[0x1e] = '\0';
      value_str[0x1f] = '\0';
      value_str[0] = '\0';
      value_str[1] = '\0';
      value_str[2] = '\0';
      value_str[3] = '\0';
      value_str[4] = '\0';
      value_str[5] = '\0';
      value_str[6] = '\0';
      value_str[7] = '\0';
      value_str[8] = '\0';
      value_str[9] = '\0';
      value_str[10] = '\0';
      value_str[0xb] = '\0';
      value_str[0xc] = '\0';
      value_str[0xd] = '\0';
      value_str[0xe] = '\0';
      value_str[0xf] = '\0';
      cam_angle[0x30] = '\0';
      cam_angle[0x31] = '\0';
      cam_angle[0x32] = '\0';
      cam_angle[0x33] = '\0';
      cam_angle[0x34] = '\0';
      cam_angle[0x35] = '\0';
      cam_angle[0x36] = '\0';
      cam_angle[0x37] = '\0';
      cam_angle[0x38] = '\0';
      cam_angle[0x39] = '\0';
      cam_angle[0x3a] = '\0';
      cam_angle[0x3b] = '\0';
      cam_angle[0x3c] = '\0';
      cam_angle[0x3d] = '\0';
      cam_angle[0x3e] = '\0';
      cam_angle[0x3f] = '\0';
      cam_angle[0x20] = '\0';
      cam_angle[0x21] = '\0';
      cam_angle[0x22] = '\0';
      cam_angle[0x23] = '\0';
      cam_angle[0x24] = '\0';
      cam_angle[0x25] = '\0';
      cam_angle[0x26] = '\0';
      cam_angle[0x27] = '\0';
      cam_angle[0x28] = '\0';
      cam_angle[0x29] = '\0';
      cam_angle[0x2a] = '\0';
      cam_angle[0x2b] = '\0';
      cam_angle[0x2c] = '\0';
      cam_angle[0x2d] = '\0';
      cam_angle[0x2e] = '\0';
      cam_angle[0x2f] = '\0';
      cam_angle[0x10] = '\0';
      cam_angle[0x11] = '\0';
      cam_angle[0x12] = '\0';
      cam_angle[0x13] = '\0';
      cam_angle[0x14] = '\0';
      cam_angle[0x15] = '\0';
      cam_angle[0x16] = '\0';
      cam_angle[0x17] = '\0';
      cam_angle[0x18] = '\0';
      cam_angle[0x19] = '\0';
      cam_angle[0x1a] = '\0';
      cam_angle[0x1b] = '\0';
      cam_angle[0x1c] = '\0';
      cam_angle[0x1d] = '\0';
      cam_angle[0x1e] = '\0';
      cam_angle[0x1f] = '\0';
      cam_angle[0] = '\0';
      cam_angle[1] = '\0';
      cam_angle[2] = '\0';
      cam_angle[3] = '\0';
      cam_angle[4] = '\0';
      cam_angle[5] = '\0';
      cam_angle[6] = '\0';
      cam_angle[7] = '\0';
      cam_angle[8] = '\0';
      cam_angle[9] = '\0';
      cam_angle[10] = '\0';
      cam_angle[0xb] = '\0';
      cam_angle[0xc] = '\0';
      cam_angle[0xd] = '\0';
      cam_angle[0xe] = '\0';
      cam_angle[0xf] = '\0';
      cam_radius[0x10] = '\0';
      cam_radius[0x11] = '\0';
      cam_radius[0x12] = '\0';
      cam_radius[0x13] = '\0';
      cam_radius[0x14] = '\0';
      cam_radius[0x15] = '\0';
      cam_radius[0x16] = '\0';
      cam_radius[0x17] = '\0';
      cam_radius[0x18] = '\0';
      cam_radius[0x19] = '\0';
      cam_radius[0x1a] = '\0';
      cam_radius[0x1b] = '\0';
      cam_radius[0x1c] = '\0';
      cam_radius[0x1d] = '\0';
      cam_radius[0x1e] = '\0';
      cam_radius[0x1f] = '\0';
      cam_radius[0] = '\0';
      cam_radius[1] = '\0';
      cam_radius[2] = '\0';
      cam_radius[3] = '\0';
      cam_radius[4] = '\0';
      cam_radius[5] = '\0';
      cam_radius[6] = '\0';
      cam_radius[7] = '\0';
      cam_radius[8] = '\0';
      cam_radius[9] = '\0';
      cam_radius[10] = '\0';
      cam_radius[0xb] = '\0';
      cam_radius[0xc] = '\0';
      cam_radius[0xd] = '\0';
      cam_radius[0xe] = '\0';
      cam_radius[0xf] = '\0';
      cam_frustum[0x10] = '\0';
      cam_frustum[0x11] = '\0';
      cam_frustum[0x12] = '\0';
      cam_frustum[0x13] = '\0';
      cam_frustum[0x14] = '\0';
      cam_frustum[0x15] = '\0';
      cam_frustum[0x16] = '\0';
      cam_frustum[0x17] = '\0';
      cam_frustum[0x18] = '\0';
      cam_frustum[0x19] = '\0';
      cam_frustum[0x1a] = '\0';
      cam_frustum[0x1b] = '\0';
      cam_frustum[0x1c] = '\0';
      cam_frustum[0x1d] = '\0';
      cam_frustum[0x1e] = '\0';
      cam_frustum[0x1f] = '\0';
      cam_frustum[0] = '\0';
      cam_frustum[1] = '\0';
      cam_frustum[2] = '\0';
      cam_frustum[3] = '\0';
      cam_frustum[4] = '\0';
      cam_frustum[5] = '\0';
      cam_frustum[6] = '\0';
      cam_frustum[7] = '\0';
      cam_frustum[8] = '\0';
      cam_frustum[9] = '\0';
      cam_frustum[10] = '\0';
      cam_frustum[0xb] = '\0';
      cam_frustum[0xc] = '\0';
      cam_frustum[0xd] = '\0';
      cam_frustum[0xe] = '\0';
      cam_frustum[0xf] = '\0';
      cam_fov[0x10] = '\0';
      cam_fov[0x11] = '\0';
      cam_fov[0x12] = '\0';
      cam_fov[0x13] = '\0';
      cam_fov[0x14] = '\0';
      cam_fov[0x15] = '\0';
      cam_fov[0x16] = '\0';
      cam_fov[0x17] = '\0';
      cam_fov[0x18] = '\0';
      cam_fov[0x19] = '\0';
      cam_fov[0x1a] = '\0';
      cam_fov[0x1b] = '\0';
      cam_fov[0x1c] = '\0';
      cam_fov[0x1d] = '\0';
      cam_fov[0x1e] = '\0';
      cam_fov[0x1f] = '\0';
      cam_fov[0] = '\0';
      cam_fov[1] = '\0';
      cam_fov[2] = '\0';
      cam_fov[3] = '\0';
      cam_fov[4] = '\0';
      cam_fov[5] = '\0';
      cam_fov[6] = '\0';
      cam_fov[7] = '\0';
      cam_fov[8] = '\0';
      cam_fov[9] = '\0';
      cam_fov[10] = '\0';
      cam_fov[0xb] = '\0';
      cam_fov[0xc] = '\0';
      cam_fov[0xd] = '\0';
      cam_fov[0xe] = '\0';
      cam_fov[0xf] = '\0';
      snprintf(value_str,0x40,"%.5f %.5f %.5f",
               SUB84((double)*(float *)((long)poVar6->focus + lVar23 + -0x28),0),
               (double)*(float *)((long)poVar6->focus + lVar23 + -0x24),
               (double)*(float *)((long)poVar6->focus + lVar23 + -0x20));
      snprintf(cam_angle,0x40,"%.5f %.5f %.5f",
               SUB84((double)*(float *)((long)poVar6->focus + lVar23 + -0x1c),0),
               (double)*(float *)((long)poVar6->focus + lVar23 + -0x18),
               (double)*(float *)((long)poVar6->focus + lVar23 + -0x14));
      snprintf(cam_radius,0x20,"%.5f",
               SUB84((double)*(float *)((long)poVar6->focus + lVar23 + -0x10),0));
      snprintf(cam_frustum,0x20,"%.5f",
               SUB84((double)*(float *)((long)poVar6->focus + lVar23 + -0xc),0));
      snprintf(cam_fov,0x20,"%i",(ulong)*(uint *)((long)poVar6->focus + lVar23 + -8));
      sVar8 = local_538.count;
      uVar12 = *(int *)((long)poVar6->focus + lVar23 + -0x2c) - 1;
      pcVar18 = "pers";
      if (uVar12 < 4) {
        pcVar18 = &DAT_0010c418 + *(int *)(&DAT_0010c418 + (ulong)uVar12 * 4);
      }
      local_53c = 0x4d414372;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)&local_53c,4);
      local_53c = 0;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)&local_53c,4);
      local_53c = 0;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)&local_53c,4);
      local_53c = *(undefined4 *)((long)poVar6->focus + lVar23 + -0x30);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)&local_53c,4);
      local_53c = 6;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)&local_53c,4);
      _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_mode",pcVar18);
      _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_focus",value_str);
      _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_angle",cam_angle);
      _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_radius",cam_radius);
      _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_frustum",cam_frustum);
      _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_fov",cam_fov);
      uVar21 = (ulong)((int)sVar8 + 4);
      if (local_538.count < uVar21 + 4) goto LAB_00107905;
      *(int *)(local_538.data + uVar21) = ((int)local_538.count - (int)sVar8) + -0xc;
      uVar15 = uVar15 + 1;
      lVar23 = lVar23 + 0x2c;
      scene = local_520;
    } while (uVar15 < local_520->num_cameras);
  }
  uVar15 = 1;
  do {
    *(ogt_vox_rgba *)(value_str + uVar15 * 4 + -4) = (scene->palette).color[uVar15 & 0xff];
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x101);
  builtin_strncpy(cam_angle,"RGBA",4);
  _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)cam_angle,4);
  cam_angle[0] = '\0';
  cam_angle[1] = '\x04';
  cam_angle[2] = '\0';
  cam_angle[3] = '\0';
  _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)cam_angle,4);
  cam_angle._0_8_ = (ulong)(uint)cam_angle._4_4_ << 0x20;
  _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)cam_angle,4);
  _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,0x400);
  poVar16 = &scene->materials;
  lVar23 = 0;
  do {
    sVar8 = local_538.count;
    uVar12 = poVar16->matl[0].content_flags;
    if (uVar12 != 0) {
      builtin_strncpy(value_str,"MATL",4);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str[0] = '\0';
      value_str[1] = '\0';
      value_str[2] = '\0';
      value_str[3] = '\0';
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str[0] = '\0';
      value_str[1] = '\0';
      value_str[2] = '\0';
      value_str[3] = '\0';
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str._0_4_ = (undefined4)lVar23;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      value_str._0_4_ =
           (uVar12 >> 0xc & 1) +
           (uVar12 >> 10 & 1) +
           (uVar12 >> 8 & 1) +
           (uVar12 >> 6 & 1) +
           (uVar12 >> 4 & 1) +
           (uVar12 >> 2 & 1) + (uVar12 & 1) + 1 + (uint)((uVar12 >> 1 & 1) != 0) +
           (uint)((uVar12 >> 3 & 1) != 0) + (uint)((uVar12 >> 5 & 1) != 0) +
           (uint)((uVar12 >> 7 & 1) != 0) + (uint)((uVar12 >> 9 & 1) != 0) +
           (uint)((uVar12 >> 0xb & 1) != 0) + (uint)((uVar12 >> 0xd & 1) != 0);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)value_str,4);
      _vox_file_write_dict_key_value
                ((_vox_file_writeable *)&local_538,"_type",
                 _ZZ19ogt_vox_write_scenePK13ogt_vox_scenePjE8type_str_rel +
                 *(int *)(_ZZ19ogt_vox_write_scenePK13ogt_vox_scenePjE8type_str_rel +
                         (ulong)poVar16->matl[0].type * 4));
      uVar12 = poVar16->matl[0].content_flags;
      if ((uVar12 & 1) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].metal,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_metal",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 & 2) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].rough,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_rough",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 & 4) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].spec,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_spec",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 & 8) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].ior,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_ior",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 & 0x10) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].att,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_att",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 & 0x20) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].flux,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_flux",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 & 0x40) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].emit,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_emit",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((char)uVar12 < '\0') {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].ldr,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_ldr",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 >> 8 & 1) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].trans,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_trans",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 >> 9 & 1) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].alpha,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_alpha",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 >> 10 & 1) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].d,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_d",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 >> 0xb & 1) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].sp,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_sp",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 >> 0xc & 1) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].g,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_g",value_str);
        uVar12 = poVar16->matl[0].content_flags;
      }
      if ((uVar12 >> 0xd & 1) != 0) {
        snprintf(value_str,0x40,"%f",SUB84((double)poVar16->matl[0].media,0));
        _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_media",value_str);
      }
      uVar15 = (ulong)((int)sVar8 + 4);
      if (local_538.count < uVar15 + 4) goto LAB_00107905;
      *(int *)(local_538.data + uVar15) = ((int)local_538.count - (int)sVar8) + -0xc;
    }
    lVar23 = lVar23 + 1;
    poVar16 = (ogt_vox_matl_array *)(poVar16->matl + 1);
  } while (lVar23 != 0x100);
  if (local_520->num_layers != 0) {
    lVar23 = 0;
    uVar15 = 0;
    do {
      poVar9 = local_520;
      poVar7 = local_520->layers;
      snprintf(value_str,0x40,"%u %u %u",(ulong)(&(poVar7->color).r)[lVar23],
               (ulong)(&(poVar7->color).g)[lVar23],(ulong)(&(poVar7->color).b)[lVar23]);
      pcVar18 = *(char **)((long)&poVar9->layers->name + lVar23);
      bVar10 = (&poVar9->layers->hidden)[lVar23];
      value = (char *)0x0;
      if (bVar10 != false) {
        value = "1";
      }
      local_518 = local_538.count;
      builtin_strncpy(cam_angle,"LAYR",4);
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)cam_angle,4);
      cam_angle[0] = '\0';
      cam_angle[1] = '\0';
      cam_angle[2] = '\0';
      cam_angle[3] = '\0';
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)cam_angle,4);
      cam_angle[0] = '\0';
      cam_angle[1] = '\0';
      cam_angle[2] = '\0';
      cam_angle[3] = '\0';
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)cam_angle,4);
      cam_angle._0_4_ = (undefined4)uVar15;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)cam_angle,4);
      cam_angle._0_4_ = ((uint)bVar10 - (uint)(pcVar18 == (char *)0x0)) + 2;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)cam_angle,4);
      _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_name",pcVar18);
      _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_hidden",value);
      _vox_file_write_dict_key_value((_vox_file_writeable *)&local_538,"_color",value_str);
      cam_angle[0] = -1;
      cam_angle[1] = -1;
      cam_angle[2] = -1;
      cam_angle[3] = -1;
      _vox_array<unsigned_char>::push_back_many(&local_538,(uchar *)cam_angle,4);
      uVar21 = (ulong)((int)local_518 + 4);
      if (local_538.count < uVar21 + 4) {
LAB_00107905:
        __assert_fail("((offset + sizeof(*data)) <= fp->data.count) && (\"write at offset must not be an append write\")"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                      ,0x8ff,
                      "void _vox_file_write_uint32_at_offset(_vox_file_writeable *, uint32_t, const uint32_t *)"
                     );
      }
      *(int *)(local_538.data + uVar21) = ((int)local_538.count - (int)local_518) + -0xc;
      uVar15 = uVar15 + 1;
      lVar23 = lVar23 + 0x10;
    } while (uVar15 < local_520->num_layers);
  }
  puVar17 = local_538.data;
  if ((local_538.count >> 0x20 != 0) || (local_538.count - uVar13 >> 0x20 != 0)) {
    __assert_fail("(0) && (\"Generated file size exceeded 4GiB, which is too large for Magicavoxel to parse.\")"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xabe,"uint8_t *ogt_vox_write_scene(const ogt_vox_scene *, uint32_t *)");
  }
  *local_500 = (uint32_t)local_538.count;
  if (local_538.count == 0) {
    __assert_fail("(index < count) && (\"index out of bounds\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x324,"T &_vox_array<unsigned char>::operator[](size_t) [T = unsigned char]");
  }
  local_538.data = (uint8_t *)0x0;
  *(uint32_t *)(puVar17 + (uVar13 - 4)) = (uint32_t)local_538.count - (int)local_4f8;
  if (g_progress_callback_func != (ogt_vox_progress_callback_func)0x0) {
    (*g_progress_callback_func)(1.0,g_progress_callback_user_data);
  }
LAB_0010789a:
  if (local_538.data != (uint8_t *)0x0) {
    (*g_free_func)(local_538.data);
  }
  return puVar17;
}

Assistant:

uint8_t* ogt_vox_write_scene(const ogt_vox_scene* scene, uint32_t* buffer_size) {
        _vox_file_writeable file;
        _vox_file_writeable_init(&file);
        _vox_file_writeable* fp = &file;

        // write file header and file version
        _vox_file_write_uint32(fp, CHUNK_ID_VOX_);
        _vox_file_write_uint32(fp, 150);

        // write the main chunk
        _vox_file_write_uint32(fp, CHUNK_ID_MAIN);
        _vox_file_write_uint32(fp, 0);
        _vox_file_write_uint32(fp, 0);  // this main_chunk_child_size will get patched up once everything is written.

        // we need to know how to patch up the main chunk size after we've written everything
        const uint32_t offset_post_main_chunk = _vox_file_get_offset(fp);

        // write out all model chunks
        for (uint32_t i = 0; i < scene->num_models; i++) {
            const ogt_vox_model* model = scene->models[i];
            ogt_assert(model->size_x <= 256 && model->size_y <= 256 && model->size_z <= 256, "model dimensions exceed the limit of 256x256x256");
            // count the number of solid voxels in the grid
            uint32_t num_voxels_in_grid = model->size_x * model->size_y * model->size_z;
            uint32_t num_solid_voxels = 0;
            for (uint32_t voxel_index = 0; voxel_index < num_voxels_in_grid; voxel_index++)
                if (model->voxel_data[voxel_index] != 0)
                    num_solid_voxels++;
            uint32_t chunk_size_xyzi = sizeof(uint32_t) + 4 * num_solid_voxels;

            // write the SIZE chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_SIZE);
            _vox_file_write_uint32(fp, 12);
            _vox_file_write_uint32(fp, 0);

            // write the SIZE chunk payload
            ogt_assert(model->size_x && model->size_y && model->size_z, "model has zero size");
            _vox_file_write_uint32(fp, model->size_x);
            _vox_file_write_uint32(fp, model->size_y);
            _vox_file_write_uint32(fp, model->size_z);

            // write the XYZI chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_XYZI);
            _vox_file_write_uint32(fp, chunk_size_xyzi);
            _vox_file_write_uint32(fp, 0);

            // write out XYZI chunk payload
            _vox_file_write_uint32(fp, num_solid_voxels);
            uint32_t voxel_index = 0;
            for (uint32_t z = 0; z < model->size_z; z++) {
                for (uint32_t y = 0; y < model->size_y; y++) {
                    for (uint32_t x = 0; x < model->size_x; x++, voxel_index++) {
                        uint8_t color_index = model->voxel_data[voxel_index];
                        if (color_index != 0) {
                            _vox_file_write_uint8(fp, (uint8_t)x);
                            _vox_file_write_uint8(fp, (uint8_t)y);
                            _vox_file_write_uint8(fp, (uint8_t)z);
                            _vox_file_write_uint8(fp, color_index);
                        }
                    }
                }
            }

            if (g_progress_callback_func) {
                // we indicate progress as number of models written, with an extra progress value for ending write
                if (!g_progress_callback_func((float)(i + 1)/(float)(scene->num_models + 1), g_progress_callback_user_data))
                {
                    *buffer_size = 0;
                    return NULL; // note: fp will be freed in dtor on exit
                }
            }
        }

        // define our node_id ranges.
        ogt_assert(scene->num_groups > 0, "no groups found in scene");
        uint32_t first_group_transform_node_id    = 0;
        uint32_t first_group_node_id              = first_group_transform_node_id + scene->num_groups;
        uint32_t first_shape_node_id              = first_group_node_id + scene->num_groups;
        uint32_t first_instance_transform_node_id = first_shape_node_id + scene->num_instances;

        // write the nTRN nodes for each of the groups in the scene.
        for (uint32_t group_index = 0; group_index < scene->num_groups; group_index++) {
            const ogt_vox_group* group = &scene->groups[group_index];
            _vox_file_write_chunk_nTRN(fp, first_group_transform_node_id + group_index, first_group_node_id + group_index, group->name, group->hidden, &group->transform, group->layer_index, &group->transform_anim);
        }
        // write the group nodes for each of the groups in the scene
        for (uint32_t group_index = 0; group_index < scene->num_groups; group_index++) {
            // count how many childnodes  there are. This is simply the sum of all
            // groups and instances that have this group as its parent
            uint32_t num_child_nodes = 0;
            for (uint32_t child_group_index = 0; child_group_index < scene->num_groups; child_group_index++)
                if (scene->groups[child_group_index].parent_group_index == group_index)
                    num_child_nodes++;
            for (uint32_t child_instance_index = 0; child_instance_index < scene->num_instances; child_instance_index++)
                if (scene->instances[child_instance_index].group_index == group_index)
                    num_child_nodes++;

            // count number of dictionary items
            const char* hidden_string = scene->groups[group_index].hidden ? "1" : NULL;
            uint32_t group_dict_keyvalue_count = (hidden_string ? 1 : 0);

            // compute the chunk size.
            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

            // write the nGRP header
            _vox_file_write_uint32(fp, CHUNK_ID_nGRP);
            _vox_file_write_uint32(fp, 0); // chunk_size will get patched up after.
            _vox_file_write_uint32(fp, 0);
            // write the nGRP payload
            _vox_file_write_uint32(fp, first_group_node_id + group_index);       // node_id
            _vox_file_write_uint32(fp, group_dict_keyvalue_count); // num keyvalue pairs in node dictionary
            _vox_file_write_dict_key_value(fp, "_hidden", hidden_string);
            _vox_file_write_uint32(fp, num_child_nodes);
            // write the child group transform nodes
            for (uint32_t child_group_index = 0; child_group_index < scene->num_groups; child_group_index++)
                if (scene->groups[child_group_index].parent_group_index == group_index)
                    _vox_file_write_uint32(fp, first_group_transform_node_id + child_group_index);
            // write the child instance transform nodes
            for (uint32_t child_instance_index = 0; child_instance_index < scene->num_instances; child_instance_index++)
                if (scene->instances[child_instance_index].group_index == group_index)
                    _vox_file_write_uint32(fp, first_instance_transform_node_id + child_instance_index);

            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // write out an nSHP chunk for each of the instances
        for (uint32_t i = 0; i < scene->num_instances; i++) {
            const ogt_vox_instance* instance = &scene->instances[i];

            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);
            // write the nSHP chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_nSHP);
            _vox_file_write_uint32(fp, 0); // will get patched up at the end
            _vox_file_write_uint32(fp, 0);
            // write the nSHP chunk payload
            _vox_file_write_uint32(fp, first_shape_node_id + i);    // node_id

            // write the nSHP node dictionary
            const char* loop_string = instance->model_anim.loop ? "1" : NULL;
            uint32_t node_dict_keyvalue_count = (loop_string ? 1 : 0);
            _vox_file_write_uint32(fp, node_dict_keyvalue_count);  // num key values
            _vox_file_write_dict_key_value(fp, "_loop",   loop_string);

            if (instance->model_anim.num_keyframes == 0 ) {
                _vox_file_write_uint32(fp, 1);                      // num_models must be 1
                _vox_file_write_uint32(fp, instance->model_index);  // model_id
                _vox_file_write_uint32(fp, 0);                      // num keyvalue pairs in model dictionary
            }
            else {
                _vox_file_write_uint32(fp, instance->model_anim.num_keyframes);
                for (uint32_t j = 0; j < instance->model_anim.num_keyframes; j++) {
                    _vox_file_write_uint32(fp, instance->model_anim.keyframes[j].model_index); // model_id
                    _vox_file_write_uint32(fp, 1); // num keyvalue pairs in model dictionary
                    _vox_file_write_dict_key_value_uint32(fp, "_f", instance->model_anim.keyframes[j].frame_index);
                }
            }
            // compute and patch up the chunk size in the chunk header
            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // write out a nTRN chunk for all instances - and make them point to the relevant nSHP chunk
        for (uint32_t i = 0; i < scene->num_instances; i++) {
            const ogt_vox_instance* instance = &scene->instances[i];
            uint32_t node_id       = first_instance_transform_node_id + i;
            uint32_t child_node_id = first_shape_node_id + i;
            _vox_file_write_chunk_nTRN(fp, node_id, child_node_id, instance->name, instance->hidden, &instance->transform, instance->layer_index, &instance->transform_anim);
        }

        // write out the rCAM chunks
        for (uint32_t i = 0; i < scene->num_cameras; i++) {
            const ogt_vox_cam* camera = &scene->cameras[i];
            char cam_focus[64] = "";
            char cam_angle[64] = "";
            char cam_radius[32] = "";
            char cam_frustum[32] = "";
            char cam_fov[32] = "";
            const char *cam_mode;
            _vox_sprintf(cam_focus, sizeof(cam_focus), "%.5f %.5f %.5f", camera->focus[0], camera->focus[1], camera->focus[2]);
            _vox_sprintf(cam_angle, sizeof(cam_angle), "%.5f %.5f %.5f", camera->angle[0], camera->angle[1], camera->angle[2]);
            _vox_sprintf(cam_radius, sizeof(cam_radius), "%.5f", camera->radius);
            _vox_sprintf(cam_frustum, sizeof(cam_frustum), "%.5f", camera->frustum);
            _vox_sprintf(cam_fov, sizeof(cam_fov), "%i", camera->fov);

            switch (camera->mode) {
            case ogt_cam_mode_free:
                cam_mode = "free";
                break;
            case ogt_cam_mode_pano:
                cam_mode = "pano";
                break;
            case ogt_cam_mode_isometric:
                cam_mode = "iso";
                break;
            case ogt_cam_mode_orthographic:
                cam_mode = "orth";
                break;
            default:
            case ogt_cam_mode_unknown:
            case ogt_cam_mode_perspective:
                cam_mode = "pers";
                break;
            }

            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

            // write the rCAM header
            _vox_file_write_uint32(fp, CHUNK_ID_rCAM);
            _vox_file_write_uint32(fp, 0); // chunk_size will get patched up later
            _vox_file_write_uint32(fp, 0);

            _vox_file_write_uint32(fp, camera->camera_id);
            _vox_file_write_uint32(fp, 6);  // num key values
            _vox_file_write_dict_key_value(fp, "_mode", cam_mode);
            _vox_file_write_dict_key_value(fp, "_focus", cam_focus);
            _vox_file_write_dict_key_value(fp, "_angle", cam_angle);
            _vox_file_write_dict_key_value(fp, "_radius", cam_radius);
            _vox_file_write_dict_key_value(fp, "_frustum", cam_frustum);
            _vox_file_write_dict_key_value(fp, "_fov", cam_fov);

            // compute and patch up the chunk size in the chunk header
            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // write out RGBA chunk for the palette
        {
            // .vox stores palette rotated by 1 color index, so do that now.
            ogt_vox_palette rotated_palette;
            for (uint32_t i = 0; i < 256; i++)
                rotated_palette.color[i] = scene->palette.color[(i + 1) & 255];

            // write the palette chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_RGBA);
            _vox_file_write_uint32(fp, sizeof(ogt_vox_palette));
            _vox_file_write_uint32(fp, 0);
            // write the palette chunk payload
            _vox_file_write(fp, &rotated_palette, sizeof(ogt_vox_palette));
        }

        // write out MATL chunk
        {
            // keep in sync with ogt_matl_type
            static const char *type_str[] = {"_diffuse", "_metal", "_glass", "_emit", "_blend", "_media"};

            for (int32_t i = 0; i < 256; ++i) {
                const ogt_vox_matl &matl = scene->materials.matl[i];
                if (matl.content_flags == 0u) {
                    continue;
                }
                uint32_t matl_dict_keyvalue_count = 1;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_metal) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_rough) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_spec)  ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_ior)   ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_att)   ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_flux)  ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_emit)  ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_ldr)   ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_trans) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_alpha) ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_d)     ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_sp)    ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_g)     ? 1 : 0;
                matl_dict_keyvalue_count += (matl.content_flags & k_ogt_vox_matl_have_media) ? 1 : 0;

                uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

                // write the material chunk header
                _vox_file_write_uint32(fp, CHUNK_ID_MATL);
                _vox_file_write_uint32(fp, 0); // chunk_size will get patched up later
                _vox_file_write_uint32(fp, 0);

                _vox_file_write_uint32(fp, i); // material id
                _vox_file_write_uint32(fp, matl_dict_keyvalue_count);
                _vox_file_write_dict_key_value(fp, "_type", type_str[matl.type]);
                if (matl.content_flags & k_ogt_vox_matl_have_metal) {
                    _vox_file_write_dict_key_value_float(fp, "_metal", matl.metal);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_rough) {
                    _vox_file_write_dict_key_value_float(fp, "_rough", matl.rough);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_spec) {
                    _vox_file_write_dict_key_value_float(fp, "_spec", matl.spec);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_ior) {
                    _vox_file_write_dict_key_value_float(fp, "_ior", matl.ior);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_att) {
                    _vox_file_write_dict_key_value_float(fp, "_att", matl.att);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_flux) {
                    _vox_file_write_dict_key_value_float(fp, "_flux", matl.flux);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_emit) {
                    _vox_file_write_dict_key_value_float(fp, "_emit", matl.emit);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_ldr) {
                    _vox_file_write_dict_key_value_float(fp, "_ldr", matl.ldr);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_trans) {
                    _vox_file_write_dict_key_value_float(fp, "_trans", matl.trans);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_alpha) {
                    _vox_file_write_dict_key_value_float(fp, "_alpha", matl.alpha);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_d) {
                    _vox_file_write_dict_key_value_float(fp, "_d", matl.d);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_sp) {
                    _vox_file_write_dict_key_value_float(fp, "_sp", matl.sp);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_g) {
                    _vox_file_write_dict_key_value_float(fp, "_g", matl.g);
                }
                if (matl.content_flags & k_ogt_vox_matl_have_media) {
                    _vox_file_write_dict_key_value_float(fp, "_media", matl.media);
                }
                // compute and patch up the chunk size in the chunk header
                uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
                _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
            }
        }

        // write all layer chunks out.
        for (uint32_t i = 0; i < scene->num_layers; i++) {
            char color_string[64];
            _vox_sprintf(color_string, sizeof(color_string), "%u %u %u", scene->layers[i].color.r, scene->layers[i].color.g, scene->layers[i].color.b);
            const char* layer_name_string = scene->layers[i].name;
            const char* hidden_string = scene->layers[i].hidden ? "1" : NULL;
            uint32_t layer_dict_keyvalue_count = 0;
            layer_dict_keyvalue_count += (layer_name_string ? 1 : 0);
            layer_dict_keyvalue_count += (hidden_string ? 1 : 0);
            layer_dict_keyvalue_count += 1; // color_string

            uint32_t offset_of_chunk_header = _vox_file_get_offset(fp);

            // write the layer chunk header
            _vox_file_write_uint32(fp, CHUNK_ID_LAYR);
            _vox_file_write_uint32(fp, 0); // chunk_size will get patched up later
            _vox_file_write_uint32(fp, 0);
            // write the layer chunk payload
            _vox_file_write_uint32(fp, i);                          // layer_id
            _vox_file_write_uint32(fp, layer_dict_keyvalue_count);  // num keyvalue pairs in layer dictionary
            _vox_file_write_dict_key_value(fp, "_name",   layer_name_string);
            _vox_file_write_dict_key_value(fp, "_hidden", hidden_string);
            _vox_file_write_dict_key_value(fp, "_color",  color_string);
            _vox_file_write_uint32(fp, UINT32_MAX);                 // reserved id

            // compute and patch up the chunk size in the chunk header
            uint32_t chunk_size = _vox_file_get_offset(fp) - offset_of_chunk_header - CHUNK_HEADER_LEN;
            _vox_file_write_uint32_at_offset(fp, offset_of_chunk_header + 4, &chunk_size);
        }

        // check that the buffer is not larger than the maximum file size, return nothing if would overflow
        if (fp->data.count > UINT32_MAX ||  (fp->data.count - offset_post_main_chunk) > UINT32_MAX)
        {
            ogt_assert(0, "Generated file size exceeded 4GiB, which is too large for Magicavoxel to parse.");
            *buffer_size = 0;
            return NULL;  // note: fp will be freed in dtor on exit
        }

        // we deliberately don't free the fp->data field, just pass the buffer pointer and size out to the caller
        *buffer_size = (uint32_t)fp->data.count;
        uint8_t* buffer_data = _vox_file_get_data(fp);
        // we deliberately clear this pointer so it doesn't get auto-freed on exiting. The caller will own the memory hereafter.
        fp->data.data = NULL;

        // patch up the main chunk's child chunk size now that we've written everything we're going to write.
        {
            uint32_t* main_chunk_child_size = (uint32_t*)& buffer_data[offset_post_main_chunk - sizeof(uint32_t)];
            *main_chunk_child_size = *buffer_size - offset_post_main_chunk;
        }

        if (g_progress_callback_func) {
            // we indicate progress as number of models written, with an extra progress value for ending write
            g_progress_callback_func(1.0f,g_progress_callback_user_data); // we ignore the return as exiting here anyway
        }

        return buffer_data;
    }